

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

QSocks5BindData * __thiscall
QSocks5BindStore::retrieve(QSocks5BindStore *this,qintptr socketDescriptor)

{
  QHash<long_long,_QSocks5BindData_*> *this_00;
  Span *pSVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  QSocks5BindData *pQVar5;
  long in_FS_OFFSET;
  QDeadlineTimer QVar6;
  const_iterator it;
  qintptr local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar6.t2 = 0xffffffff;
  QVar6.type = 0x7fffffff;
  QVar6.t1 = (qint64)&this->mutex;
  local_38 = socketDescriptor;
  QRecursiveMutex::tryLock(QVar6);
  this_00 = &this->store;
  it = QHash<long_long,_QSocks5BindData_*>::constFindImpl<long_long>(this_00,&local_38);
  if (it.i.d == (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0x0 && it.i.bucket == 0)
  {
LAB_00237431:
    pQVar5 = (QSocks5BindData *)0x0;
  }
  else {
    pSVar1 = (it.i.d)->spans;
    uVar4 = it.i.bucket >> 7;
    pQVar5 = *(QSocks5BindData **)
              (pSVar1[uVar4].entries[pSVar1[uVar4].offsets[(uint)it.i.bucket & 0x7f]].storage.data +
              8);
    QHash<long_long,_QSocks5BindData_*>::erase(this_00,it);
    if (pQVar5 != (QSocks5BindData *)0x0) {
      lVar2 = QObject::thread();
      lVar3 = QThread::currentThread();
      if (lVar2 != lVar3) {
        retrieve();
        goto LAB_00237431;
      }
    }
    if ((this_00->d == (Data *)0x0) || (this_00->d->size == 0)) {
      QBasicTimer::stop();
    }
  }
  QRecursiveMutex::unlock();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QSocks5BindData *QSocks5BindStore::retrieve(qintptr socketDescriptor)
{
    QMutexLocker lock(&mutex);
    const auto it = store.constFind(socketDescriptor);
    if (it == store.cend())
        return nullptr;
    QSocks5BindData *bindData = it.value();
    store.erase(it);
    if (bindData) {
        if (bindData->controlSocket->thread() != QThread::currentThread()) {
            qWarning("Cannot access socks5 bind data from different thread");
            return nullptr;
        }
    } else {
        QSOCKS5_DEBUG << "__ERROR__ binddata == 0";
    }
    // stop the sweep timer if not needed
    if (store.isEmpty())
        sweepTimer.stop();
    return bindData;
}